

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  BtShared *pBVar1;
  BtCursor *in_RDI;
  BtCursor *pPrev;
  BtShared *pBt;
  Btree *pBtree;
  BtCursor *in_stack_ffffffffffffffe0;
  
  if (in_RDI->pBtree != (Btree *)0x0) {
    pBVar1 = in_RDI->pBt;
    sqlite3BtreeEnter((Btree *)0x17195b);
    if (pBVar1->pCursor == in_RDI) {
      pBVar1->pCursor = in_RDI->pNext;
    }
    else {
      in_stack_ffffffffffffffe0 = pBVar1->pCursor;
      do {
        if (in_stack_ffffffffffffffe0->pNext == in_RDI) {
          in_stack_ffffffffffffffe0->pNext = in_RDI->pNext;
          break;
        }
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->pNext;
      } while (in_stack_ffffffffffffffe0 != (BtCursor *)0x0);
    }
    btreeReleaseAllCursorPages(in_stack_ffffffffffffffe0);
    unlockBtreeIfUnused((BtShared *)in_stack_ffffffffffffffe0);
    sqlite3_free((void *)0x1719eb);
    sqlite3_free((void *)0x1719f9);
    if (((pBVar1->openFlags & 4) == 0) || (pBVar1->pCursor != (BtCursor *)0x0)) {
      sqlite3BtreeLeave((Btree *)0x171a2c);
    }
    else {
      sqlite3BtreeClose((Btree *)in_stack_ffffffffffffffe0);
    }
    in_RDI->pBtree = (Btree *)0x0;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    btreeReleaseAllCursorPages(pCur);
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    if( (pBt->openFlags & BTREE_SINGLE) && pBt->pCursor==0 ){
      /* Since the BtShared is not sharable, there is no need to
      ** worry about the missing sqlite3BtreeLeave() call here.  */
      assert( pBtree->sharable==0 );
      sqlite3BtreeClose(pBtree);
    }else{
      sqlite3BtreeLeave(pBtree);
    }
    pCur->pBtree = 0;
  }
  return SQLITE_OK;
}